

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_util.cpp
# Opt level: O3

ByteData256 *
cfd::core::CryptoUtil::HmacSha256
          (ByteData256 *__return_storage_ptr__,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *key,ByteData *data)

{
  uchar *key_00;
  pointer puVar1;
  undefined8 bytes;
  int iVar2;
  uchar *bytes_out;
  CfdException *this;
  value_type_conflict *__val;
  int ret;
  int local_84;
  undefined1 local_80 [32];
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_60;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  
  bytes_out = (uchar *)operator_new(0x20);
  local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = bytes_out + 0x20;
  bytes_out[0] = '\0';
  bytes_out[1] = '\0';
  bytes_out[2] = '\0';
  bytes_out[3] = '\0';
  bytes_out[4] = '\0';
  bytes_out[5] = '\0';
  bytes_out[6] = '\0';
  bytes_out[7] = '\0';
  bytes_out[8] = '\0';
  bytes_out[9] = '\0';
  bytes_out[10] = '\0';
  bytes_out[0xb] = '\0';
  bytes_out[0xc] = '\0';
  bytes_out[0xd] = '\0';
  bytes_out[0xe] = '\0';
  bytes_out[0xf] = '\0';
  bytes_out[0x10] = '\0';
  bytes_out[0x11] = '\0';
  bytes_out[0x12] = '\0';
  bytes_out[0x13] = '\0';
  bytes_out[0x14] = '\0';
  bytes_out[0x15] = '\0';
  bytes_out[0x16] = '\0';
  bytes_out[0x17] = '\0';
  bytes_out[0x18] = '\0';
  bytes_out[0x19] = '\0';
  bytes_out[0x1a] = '\0';
  bytes_out[0x1b] = '\0';
  bytes_out[0x1c] = '\0';
  bytes_out[0x1d] = '\0';
  bytes_out[0x1e] = '\0';
  bytes_out[0x1f] = '\0';
  key_00 = (key->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar1 = (key->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = bytes_out;
  local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_finish;
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_80,data);
  bytes = local_80._0_8_;
  ByteData::GetBytes(&local_48,data);
  iVar2 = wally_hmac_sha256(key_00,(long)puVar1 - (long)key_00,(uchar *)bytes,
                            (long)local_48.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                            (long)local_48.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start,bytes_out,0x20);
  if (local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if ((uchar *)local_80._0_8_ != (uchar *)0x0) {
    operator_delete((void *)local_80._0_8_);
  }
  local_84 = iVar2;
  if (iVar2 == 0) {
    ByteData256::ByteData256(__return_storage_ptr__,&local_60);
    if (local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (uchar *)0x0) {
      operator_delete(local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    return __return_storage_ptr__;
  }
  local_80._0_8_ = "cfdcore_util.cpp";
  local_80._8_4_ = 0x2ed;
  local_80._16_8_ = "HmacSha256";
  logger::log<int&>((CfdSourceLocation *)local_80,kCfdLogLevelWarning,"wally_hmac_sha256 NG[{}].",
                    &local_84);
  this = (CfdException *)__cxa_allocate_exception(0x30);
  local_80._0_8_ = local_80 + 0x10;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"HmacSha256 error.","");
  CfdException::CfdException(this,kCfdIllegalStateError,(string *)local_80);
  __cxa_throw(this,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

ByteData256 CryptoUtil::HmacSha256(
    const std::vector<uint8_t> &key, const ByteData &data) {
  std::vector<uint8_t> output(HMAC_SHA256_LEN);

  // HMAC SHA-256
  int ret = wally_hmac_sha256(
      key.data(), key.size(), data.GetBytes().data(), data.GetBytes().size(),
      output.data(), output.size());
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_hmac_sha256 NG[{}].", ret);
    throw CfdException(kCfdIllegalStateError, "HmacSha256 error.");
  }

  return ByteData256(output);
}